

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  byte *pbVar5;
  undefined3 uVar6;
  bool bVar7;
  byte abVar8 [4];
  stbi_uc *psVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  uint x_00;
  uint uVar13;
  int iVar14;
  int iVar15;
  stbi_uc *psVar16;
  stbi_uc *psVar17;
  stbi_uc *psVar18;
  uchar *puVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  undefined7 uVar23;
  ulong __n;
  int iVar24;
  uchar *puVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  uchar raw_data [4];
  uint local_8c;
  byte local_84 [4];
  undefined8 local_80;
  uint local_74;
  ulong local_70;
  undefined8 local_68;
  stbi_uc *local_60;
  uchar *local_58;
  uint local_4c;
  stbi_uc *local_48;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  uVar6 = (undefined3)((uint)req_comp >> 8);
  psVar16 = s->img_buffer;
  psVar17 = s->img_buffer_end;
  if (psVar16 < psVar17) {
    s->img_buffer = psVar16 + 1;
    local_68 = (stbi_uc *)
               CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar16));
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
  }
  else {
    psVar18 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar17 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
    }
    else {
      psVar17 = psVar18 + iVar12;
      local_68 = (stbi_uc *)
                 CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar18));
    }
    s->img_buffer_end = psVar17;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
  }
  if (psVar16 < psVar17) {
    s->img_buffer = psVar16 + 1;
    bVar1 = *psVar16;
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar1 = 0;
  }
  else {
    psVar16 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar16,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar17 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar1 = 0;
    }
    else {
      psVar17 = psVar16 + iVar12;
      bVar1 = *psVar16;
    }
    s->img_buffer_end = psVar17;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
  }
  if (psVar16 < psVar17) {
    s->img_buffer = psVar16 + 1;
    bVar2 = *psVar16;
  }
  else if (s->read_from_callbacks == 0) {
    bVar2 = 0;
  }
  else {
    psVar17 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar2 = 0;
    }
    else {
      psVar16 = psVar17 + iVar12;
      bVar2 = *psVar17;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar12 = stbi__get16le(s);
  local_4c = stbi__get16le(s);
  psVar17 = s->img_buffer;
  local_60 = (stbi_uc *)CONCAT44(local_60._4_4_,iVar12);
  local_80 = (uint *)comp;
  local_3c = req_comp;
  if (psVar17 < s->img_buffer_end) {
    s->img_buffer = psVar17 + 1;
    uVar21 = (ulong)CONCAT31(uVar6,*psVar17);
  }
  else if (s->read_from_callbacks == 0) {
    uVar21 = 0;
  }
  else {
    psVar17 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar21 = 0;
    }
    else {
      psVar16 = psVar17 + iVar12;
      uVar21 = (ulong)CONCAT31(uVar6,*psVar17);
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar13 = stbi__get16le(s);
  local_70 = (ulong)uVar13;
  psVar16 = s->img_buffer;
  psVar17 = s->img_buffer_end;
  if (psVar16 < psVar17) {
    s->img_buffer = psVar16 + 1;
    local_8c = (uint)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar16);
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_8c = 0;
  }
  else {
    psVar18 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar17 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_8c = 0;
    }
    else {
      psVar17 = psVar18 + iVar12;
      local_8c = (uint)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar18);
    }
    s->img_buffer_end = psVar17;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
    uVar13 = (uint)local_70;
  }
  if (psVar16 < psVar17) {
    s->img_buffer = psVar16 + 1;
    bVar3 = *psVar16;
  }
  else if (s->read_from_callbacks == 0) {
    bVar3 = 0;
  }
  else {
    psVar17 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar3 = 0;
    }
    else {
      psVar16 = psVar17 + iVar12;
      bVar3 = *psVar17;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
    uVar13 = (uint)local_70;
  }
  local_84[0] = 0;
  local_84[1] = 0;
  local_84[2] = 0;
  local_84[3] = 0;
  uVar23 = (undefined7)(uVar21 >> 8);
  if (bVar1 == 0) {
    uVar20 = local_8c & 0xff;
    if (0xf < (local_8c & 0xff)) {
      if ((uVar20 == 0x20) || (uVar20 == 0x18)) {
        uVar21 = (ulong)local_8c;
        goto LAB_001133c7;
      }
      if (uVar20 != 0x10) goto LAB_001133b7;
      uVar20 = bVar2 - 8;
      if (bVar2 < 8) {
        uVar20 = (uint)bVar2;
      }
      if (uVar20 != 3) goto LAB_00113391;
      uVar20 = (uint)CONCAT71(uVar23,2);
      goto LAB_001133cb;
    }
    if ((local_8c & 0xff) == 8) goto LAB_001133a4;
    if (uVar20 != 0xf) goto LAB_001133b7;
LAB_00113391:
    uVar20 = (uint)CONCAT71(uVar23,3);
    bVar7 = true;
    bVar28 = false;
  }
  else {
    uVar20 = (uint)uVar21 & 0xff;
    if (uVar20 < 0x18) {
      if (uVar20 - 0xf < 2) goto LAB_00113391;
      if (uVar20 != 8) goto LAB_001133b7;
LAB_001133a4:
      bVar28 = true;
      bVar7 = false;
      uVar20 = (uint)CONCAT71(uVar23,1);
    }
    else {
      if ((uVar20 != 0x18) && (uVar20 != 0x20)) {
LAB_001133b7:
        stbi__g_failure_reason = "bad format";
        return (void *)0x0;
      }
LAB_001133c7:
      uVar20 = (uint)CONCAT71((int7)(uVar21 >> 8),(byte)uVar21 >> 3);
LAB_001133cb:
      bVar28 = true;
      bVar7 = false;
    }
  }
  uVar22 = uVar20 & 0xff;
  *x = x_00;
  *y = uVar13;
  if (local_80 != (uint *)0x0) {
    *local_80 = uVar22;
  }
  local_40 = uVar20;
  iVar12 = stbi__mad3sizes_valid(x_00,uVar13,uVar22,0);
  if (iVar12 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_58 = (uchar *)stbi__malloc_mad3(x_00,uVar13,uVar22,0);
  if (local_58 != (uchar *)0x0) {
    stbi__skip(s,(uint)(byte)local_68);
    puVar19 = local_58;
    local_80 = (uint *)(CONCAT44(local_80._4_4_,uVar20) & 0xffffffff000000ff);
    iVar12 = (int)local_70;
    if ((bVar2 < 8 && bVar1 == 0) && !bVar7) {
      if ((int)local_70 != 0) {
        iVar14 = x_00 * (int)local_80;
        iVar24 = 0;
        do {
          iVar12 = iVar12 + -1;
          iVar15 = iVar24;
          if ((bVar3 >> 5 & 1) == 0) {
            iVar15 = iVar12;
          }
          stbi__getn(s,puVar19 + iVar15 * iVar14,iVar14);
          iVar24 = iVar24 + 1;
        } while (iVar12 != 0);
      }
    }
    else {
      if (bVar1 == 0) {
        local_48 = (stbi_uc *)0x0;
      }
      else {
        stbi__skip(s,(int)local_60);
        uVar13 = local_4c;
        psVar17 = (stbi_uc *)stbi__malloc_mad2(local_4c,uVar22,0);
        if (psVar17 == (stbi_uc *)0x0) {
          free(local_58);
          goto LAB_00113545;
        }
        local_48 = psVar17;
        if (bVar28) {
          iVar14 = stbi__getn(s,psVar17,uVar13 * uVar22);
          if (iVar14 == 0) {
            free(local_58);
            free(psVar17);
            stbi__g_failure_reason = "bad palette";
            return (void *)0x0;
          }
        }
        else if (uVar13 != 0) {
          psVar17 = psVar17 + 2;
          do {
            uVar20 = stbi__get16le(s);
            psVar17[-2] = (stbi_uc)(((uVar20 >> 10 & 0x1f) * 0xff) / 0x1f);
            psVar17[-1] = (stbi_uc)(((uVar20 >> 5 & 0x1f) * 0xff) / 0x1f);
            *psVar17 = (stbi_uc)(((uVar20 & 0x1f) * 0xff) / 0x1f);
            psVar17 = psVar17 + uVar22;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
          iVar12 = (int)local_70;
        }
      }
      if (iVar12 * x_00 != 0) {
        local_68 = s->buffer_start;
        psVar17 = s->buffer_start + 1;
        __n = (ulong)local_80 & 0xffffffff;
        local_38 = (ulong)(iVar12 * x_00);
        bVar10 = true;
        uVar21 = 0;
        local_74 = 0;
        iVar12 = 0;
        local_60 = psVar17;
        do {
          psVar16 = local_68;
          if (bVar2 < 8) {
LAB_001136e8:
            psVar16 = local_68;
            if (bVar1 == 0) {
              if (bVar28) {
                if ((int)local_80 == 0) goto LAB_001138f4;
                psVar16 = s->img_buffer;
                psVar18 = s->img_buffer_end;
                uVar26 = 0;
                do {
                  psVar9 = local_68;
                  if (psVar16 < psVar18) {
                    s->img_buffer = psVar16 + 1;
                    bVar11 = *psVar16;
                    psVar16 = psVar16 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar11 = 0;
                  }
                  else {
                    iVar14 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
                    if (iVar14 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar11 = 0;
                      psVar18 = local_60;
                    }
                    else {
                      bVar11 = *psVar9;
                      psVar18 = psVar9 + iVar14;
                    }
                    s->img_buffer_end = psVar18;
                    s->img_buffer = local_60;
                    psVar16 = local_60;
                    psVar17 = local_60;
                  }
                  local_84[uVar26] = bVar11;
                  uVar26 = uVar26 + 1;
                } while (__n != uVar26);
              }
              else {
                uVar13 = stbi__get16le(s);
                abVar8 = local_84;
                local_84[1] = (char)(((uVar13 >> 5 & 0x1f) * 0xff) / 0x1f);
                local_84[0] = (char)(((uVar13 >> 10 & 0x1f) * 0xff) / 0x1f);
                local_84[3] = abVar8[3];
                local_84[2] = (char)(((uVar13 & 0x1f) * 0xff) / 0x1f);
              }
              goto LAB_0011383b;
            }
            if ((char)local_8c == '\b') {
              pbVar5 = s->img_buffer;
              if (pbVar5 < s->img_buffer_end) {
                s->img_buffer = pbVar5 + 1;
                bVar11 = *pbVar5;
              }
              else if (s->read_from_callbacks == 0) {
                bVar11 = 0;
              }
              else {
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
                if (iVar14 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar11 = 0;
                  psVar17 = local_60;
                }
                else {
                  bVar11 = *psVar16;
                  psVar17 = psVar16 + iVar14;
                }
                s->img_buffer_end = psVar17;
                s->img_buffer = local_60;
                psVar17 = local_60;
              }
              uVar13 = (uint)bVar11;
            }
            else {
              uVar13 = stbi__get16le(s);
            }
            if ((int)local_80 != 0) {
              if (local_4c <= uVar13) {
                uVar13 = 0;
              }
              memcpy(local_84,local_48 + uVar13 * (int)local_80,__n);
              goto LAB_001138d9;
            }
          }
          else {
            if (iVar12 == 0) {
              pbVar5 = s->img_buffer;
              if (pbVar5 < s->img_buffer_end) {
                s->img_buffer = pbVar5 + 1;
                bVar11 = *pbVar5;
              }
              else if (s->read_from_callbacks == 0) {
                bVar11 = 0;
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar11 = 0;
                  psVar16 = psVar17;
                }
                else {
                  bVar11 = *psVar16;
                  psVar16 = psVar16 + iVar12;
                }
                s->img_buffer_end = psVar16;
                s->img_buffer = psVar17;
              }
              iVar12 = (bVar11 & 0x7f) + 1;
              local_74 = (uint)(bVar11 >> 7);
              goto LAB_001136e8;
            }
            bVar27 = local_74 != 0;
            local_74 = 1;
            if (!bVar27 || bVar10) {
              local_74 = (uint)bVar27;
              goto LAB_001136e8;
            }
LAB_0011383b:
            if ((int)local_80 != 0) {
LAB_001138d9:
              memcpy(local_58 + (uint)((int)local_80 * (int)uVar21),local_84,__n);
            }
          }
LAB_001138f4:
          iVar12 = iVar12 + -1;
          uVar21 = uVar21 + 1;
          bVar10 = false;
        } while (uVar21 != local_38);
      }
      puVar19 = local_58;
      if ((bVar3 >> 5 & 1) == 0 && (int)local_70 != 0) {
        iVar12 = x_00 * (int)local_80;
        uVar20 = (int)local_70 - 1;
        iVar14 = iVar12 * uVar20;
        uVar22 = 0;
        uVar13 = 0;
        do {
          if (iVar12 != 0) {
            puVar25 = local_58;
            iVar24 = iVar12 + 1;
            do {
              uVar4 = puVar25[uVar22];
              puVar25[uVar22] = puVar25[iVar14];
              puVar25[iVar14] = uVar4;
              puVar25 = puVar25 + 1;
              iVar24 = iVar24 + -1;
            } while (1 < iVar24);
          }
          iVar14 = iVar14 - iVar12;
          uVar22 = uVar22 + iVar12;
          bVar28 = uVar13 != uVar20 >> 1;
          uVar13 = uVar13 + 1;
        } while (bVar28);
      }
      if (local_48 != (stbi_uc *)0x0) {
        free(local_48);
      }
    }
    if ((!bVar7 && 2 < (byte)local_40) && (iVar12 = (uint)local_70 * x_00, iVar12 != 0)) {
      puVar25 = puVar19 + 2;
      do {
        uVar4 = puVar25[-2];
        puVar25[-2] = *puVar25;
        *puVar25 = uVar4;
        puVar25 = puVar25 + ((ulong)local_80 & 0xffffffff);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    if (local_3c != 0) {
      if ((int)local_80 != local_3c) {
        puVar19 = stbi__convert_format(puVar19,(int)local_80,local_3c,x_00,(uint)local_70);
        return puVar19;
      }
      return puVar19;
    }
    return puVar19;
  }
LAB_00113545:
  stbi__g_failure_reason = "outofmem";
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}